

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertySetDefinition::~IfcPropertySetDefinition
          (IfcPropertySetDefinition *this,void **vtt)

{
  void **vtt_local;
  IfcPropertySetDefinition *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition,_0UL> *)
             &(this->super_IfcPropertyDefinition).super_IfcRoot.field_0x98,vtt + 10);
  IfcPropertyDefinition::~IfcPropertyDefinition(&this->super_IfcPropertyDefinition,vtt + 1);
  return;
}

Assistant:

IfcPropertySetDefinition() : Object("IfcPropertySetDefinition") {}